

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

void free_obj(OBJ_DATA *obj)

{
  OBJ_AFFECT_DATA *pOVar1;
  OBJ_DATA *in_RDI;
  EXTRA_DESCR_DATA *ed_next;
  EXTRA_DESCR_DATA *ed;
  OBJ_AFFECT_DATA *paf_next;
  OBJ_AFFECT_DATA *paf;
  EXTRA_DESCR_DATA *pstr;
  OBJ_AFFECT_DATA *local_10;
  
  if ((in_RDI != (OBJ_DATA *)0x0) && ((in_RDI->valid & 1U) != 0)) {
    local_10 = in_RDI->affected;
    while (local_10 != (OBJ_AFFECT_DATA *)0x0) {
      pOVar1 = local_10->next;
      free_affect_obj(local_10);
      local_10 = pOVar1;
    }
    in_RDI->affected = (OBJ_AFFECT_DATA *)0x0;
    pstr = in_RDI->extra_descr;
    while (pstr != (EXTRA_DESCR_DATA *)0x0) {
      pstr = pstr->next;
      free_extra_descr((EXTRA_DESCR_DATA *)0x6247c3);
    }
    in_RDI->extra_descr = (EXTRA_DESCR_DATA *)0x0;
    free_pstring((char *)0x0);
    free_pstring((char *)pstr);
    free_pstring((char *)pstr);
    in_RDI->valid = false;
    in_RDI->next = obj_free;
    obj_free = in_RDI;
  }
  return;
}

Assistant:

void free_obj(OBJ_DATA *obj)
{
	OBJ_AFFECT_DATA *paf, *paf_next;
	EXTRA_DESCR_DATA *ed, *ed_next;

	if (!(obj != nullptr && obj->valid))
		return;

	for (paf = obj->affected; paf != nullptr; paf = paf_next)
	{
		paf_next = paf->next;
		free_affect_obj(paf);
	}

	obj->affected = nullptr;

	for (ed = obj->extra_descr; ed != nullptr; ed = ed_next)
	{
		ed_next = ed->next;
		free_extra_descr(ed);
	}

	obj->extra_descr = nullptr;

	free_pstring(obj->name);
	free_pstring(obj->description);
	free_pstring(obj->short_descr);

	// free_pstring( obj->owner     );
	obj->valid = false;
	obj->next = obj_free;
	obj_free = obj;
}